

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

CallArgHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int func_index,
          int num_args)

{
  Impl *pIVar1;
  Error *this_00;
  BasicIteratedExprBuilder<mp::CallExpr> BVar2;
  CallArgHandler CVar3;
  
  pIVar1 = (this->builder_->super_ExprFactory).funcs_.
           super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
           ._M_impl.super__Vector_impl_data._M_start[func_index];
  if (pIVar1 == (Impl *)0x0) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x22b585,func_index);
    __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  BVar2 = BasicExprFactory<std::allocator<char>_>::BeginIterated<mp::CallExpr>
                    (&this->builder_->super_ExprFactory,CALL,num_args);
  (BVar2.impl_)->func = pIVar1;
  CVar3.impl_ = BVar2.impl_;
  CVar3.arg_index_ = BVar2.arg_index_;
  CVar3._12_4_ = BVar2._12_4_;
  return CVar3;
}

Assistant:

CallArgHandler BeginCall(int func_index, int num_args) {
    // Check if the function is defined.
    if (Function func = builder_.function(func_index))
      return builder_.BeginCall(func, num_args);
    throw Error("function {} is not defined", func_index);
  }